

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_fighterquietus.cpp
# Opt level: O0

int AF_A_FSwordAttack(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  PClass *pPVar1;
  AActor *pAVar2;
  bool bVar3;
  bool local_92;
  bool local_8f;
  FSoundID local_8c;
  TAngle<double> local_88;
  TAngle<double> local_80;
  TAngle<double> local_78;
  TAngle<double> local_70;
  TAngle<double> local_68;
  AWeapon *local_60;
  AWeapon *weapon;
  player_t *player;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  VMValue *pVStack_20;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pVStack_20 = param;
  param_local = (VMValue *)stack;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighterquietus.cpp"
                  ,0x51,"int AF_A_FSwordAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar3 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar3 = true, (param->field_0).field_1.atag != 1)) {
    bVar3 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar3) {
    stateowner = (AActor *)(param->field_0).field_1.a;
    local_8f = true;
    if (stateowner != (AActor *)0x0) {
      local_8f = DObject::IsKindOf((DObject *)stateowner,AActor::RegistrationInfo.MyClass);
    }
    if (local_8f == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighterquietus.cpp"
                    ,0x51,"int AF_A_FSwordAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_20[(int)self].field_0.field_3.Type != 0xff)) {
      bVar3 = false;
      if ((pVStack_20[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar3 = true, pVStack_20[(int)self].field_0.field_1.atag != 1)) {
        bVar3 = pVStack_20[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar3) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighterquietus.cpp"
                      ,0x51,"int AF_A_FSwordAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                     );
      }
      stateinfo = (FStateParamInfo *)pVStack_20[(int)self].field_0.field_1.a;
      local_92 = true;
      if ((DObject *)stateinfo != (DObject *)0x0) {
        local_92 = DObject::IsKindOf((DObject *)stateinfo,AActor::RegistrationInfo.MyClass);
      }
      if (local_92 == false) {
        __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighterquietus.cpp"
                      ,0x51,"int AF_A_FSwordAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                     );
      }
    }
    else {
      stateinfo = (FStateParamInfo *)stateowner;
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_20[(int)self].field_0.field_3.Type != 0xff)) {
      bVar3 = false;
      if ((pVStack_20[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar3 = true, pVStack_20[(int)self].field_0.field_1.atag != 8)) {
        bVar3 = pVStack_20[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar3) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighterquietus.cpp"
                      ,0x51,"int AF_A_FSwordAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                     );
      }
      player = (player_t *)pVStack_20[(int)self].field_0.field_1.a;
    }
    else {
      player = (player_t *)0x0;
    }
    weapon = (AWeapon *)stateowner->player;
    if ((weapon != (AWeapon *)0x0) &&
       ((local_60 = stateowner->player->ReadyWeapon, local_60 == (AWeapon *)0x0 ||
        (bVar3 = AWeapon::DepleteAmmo(local_60,(bool)(local_60->bAltFire & 1),true,-1), bVar3)))) {
      pAVar2 = stateowner;
      pPVar1 = AFSwordMissile::RegistrationInfo.MyClass;
      TAngle<double>::operator+(&local_68,11.25);
      P_SpawnPlayerMissile
                (pAVar2,0.0,0.0,-10.0,(PClassActor *)pPVar1,&local_68,(FTranslatedLineTarget *)0x0,
                 (AActor **)0x0,false,false,0);
      pAVar2 = stateowner;
      pPVar1 = AFSwordMissile::RegistrationInfo.MyClass;
      TAngle<double>::operator+(&local_70,5.625);
      P_SpawnPlayerMissile
                (pAVar2,0.0,0.0,-5.0,(PClassActor *)pPVar1,&local_70,(FTranslatedLineTarget *)0x0,
                 (AActor **)0x0,false,false,0);
      pAVar2 = stateowner;
      pPVar1 = AFSwordMissile::RegistrationInfo.MyClass;
      TAngle<double>::TAngle(&local_78,&(stateowner->Angles).Yaw);
      P_SpawnPlayerMissile
                (pAVar2,0.0,0.0,0.0,(PClassActor *)pPVar1,&local_78,(FTranslatedLineTarget *)0x0,
                 (AActor **)0x0,false,false,0);
      pAVar2 = stateowner;
      pPVar1 = AFSwordMissile::RegistrationInfo.MyClass;
      TAngle<double>::operator-(&local_80,5.625);
      P_SpawnPlayerMissile
                (pAVar2,0.0,0.0,5.0,(PClassActor *)pPVar1,&local_80,(FTranslatedLineTarget *)0x0,
                 (AActor **)0x0,false,false,0);
      pAVar2 = stateowner;
      pPVar1 = AFSwordMissile::RegistrationInfo.MyClass;
      TAngle<double>::operator-(&local_88,11.25);
      P_SpawnPlayerMissile
                (pAVar2,0.0,0.0,10.0,(PClassActor *)pPVar1,&local_88,(FTranslatedLineTarget *)0x0,
                 (AActor **)0x0,false,false,0);
      pAVar2 = stateowner;
      FSoundID::FSoundID(&local_8c,"FighterSwordFire");
      S_Sound(pAVar2,1,&local_8c,1.0,1.0);
    }
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighterquietus.cpp"
                ,0x51,"int AF_A_FSwordAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FSwordAttack)
{
	PARAM_ACTION_PROLOGUE;

	player_t *player;

	if (NULL == (player = self->player))
	{
		return 0;
	}
	AWeapon *weapon = self->player->ReadyWeapon;
	if (weapon != NULL)
	{
		if (!weapon->DepleteAmmo (weapon->bAltFire))
			return 0;
	}
	P_SpawnPlayerMissile (self, 0, 0, -10, RUNTIME_CLASS(AFSwordMissile), self->Angles.Yaw + (45./4));
	P_SpawnPlayerMissile (self, 0, 0,  -5, RUNTIME_CLASS(AFSwordMissile), self->Angles.Yaw + (45./8));
	P_SpawnPlayerMissile (self, 0, 0,   0, RUNTIME_CLASS(AFSwordMissile),  self->Angles.Yaw);
	P_SpawnPlayerMissile (self, 0, 0,   5, RUNTIME_CLASS(AFSwordMissile), self->Angles.Yaw - (45./8));
	P_SpawnPlayerMissile (self, 0, 0,  10, RUNTIME_CLASS(AFSwordMissile), self->Angles.Yaw - (45./4));
	S_Sound (self, CHAN_WEAPON, "FighterSwordFire", 1, ATTN_NORM);
	return 0;
}